

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool __thiscall libcellml::Units::removeUnit(Units *this,size_t index)

{
  EntityImpl *pEVar1;
  size_type sVar2;
  ulong uVar3;
  
  pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  sVar2 = pEVar1[2].mId.field_2._M_allocated_capacity;
  uVar3 = (long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) - sVar2) / 0x70;
  if (index < uVar3) {
    std::vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_>::erase
              ((vector<libcellml::UnitDefinition,_std::allocator<libcellml::UnitDefinition>_> *)
               &pEVar1[2].mId.field_2,(UnitDefinition *)(sVar2 + index * 0x70));
  }
  return index < uVar3;
}

Assistant:

bool Units::removeUnit(size_t index)
{
    bool status = false;
    if (index < pFunc()->mUnitDefinitions.size()) {
        pFunc()->mUnitDefinitions.erase(pFunc()->mUnitDefinitions.begin() + ptrdiff_t(index));
        status = true;
    }

    return status;
}